

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int64 ma_dr_wav_aiff_extented_to_s64(ma_uint8 *data)

{
  byte bVar1;
  uint uVar2;
  ma_int64 mVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar1 = *data;
  uVar5 = *(ulong *)(data + 2);
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar2 = (bVar1 & 0x7f) << 8 | (uint)data[1];
  if ((uVar2 != 0) || (uVar5 != 0)) {
    if ((uVar2 == 0x7fff) || (0x3f < uVar2 - 0x3fff)) {
      mVar3 = -0x8000000000000000;
      if (-1 < (char)bVar1) {
        mVar3 = 0x7fffffffffffffff;
      }
      return mVar3;
    }
    if (uVar2 != 0x3fff) {
      uVar5 = uVar5 >> (0x3e - data[1] & 0x3f);
      uVar4 = -uVar5;
      if (-1 < (char)bVar1) {
        uVar4 = uVar5;
      }
      return uVar4;
    }
  }
  return 0;
}

Assistant:

MA_PRIVATE ma_int64 ma_dr_wav_aiff_extented_to_s64(const ma_uint8* data)
{
    ma_uint32 exponent = ((ma_uint32)data[0] << 8) | data[1];
    ma_uint64 hi = ((ma_uint64)data[2] << 24) | ((ma_uint64)data[3] << 16) | ((ma_uint64)data[4] <<  8) | ((ma_uint64)data[5] <<  0);
    ma_uint64 lo = ((ma_uint64)data[6] << 24) | ((ma_uint64)data[7] << 16) | ((ma_uint64)data[8] <<  8) | ((ma_uint64)data[9] <<  0);
    ma_uint64 significand = (hi << 32) | lo;
    int sign = exponent >> 15;
    exponent &= 0x7FFF;
    if (exponent == 0 && significand == 0) {
        return 0;
    } else if (exponent == 0x7FFF) {
        return sign ? MA_DR_WAV_INT64_MIN : MA_DR_WAV_INT64_MAX;
    }
    exponent -= 16383;
    if (exponent > 63) {
        return sign ? MA_DR_WAV_INT64_MIN : MA_DR_WAV_INT64_MAX;
    } else if (exponent < 1) {
        return 0;
    }
    significand >>= (63 - exponent);
    if (sign) {
        return -(ma_int64)significand;
    } else {
        return  (ma_int64)significand;
    }
}